

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-lexer.cc
# Opt level: O3

Token * __thiscall wabt::WastLexer::GetKeywordToken(Token *__return_storage_ptr__,WastLexer *this)

{
  char *pcVar1;
  TokenType token_type;
  byte *pbVar2;
  Location loc;
  Location loc_00;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  TokenInfo *pTVar7;
  byte *pbVar8;
  byte *pbVar9;
  anon_class_8_1_8991fb9c column;
  uint uVar10;
  uint uVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  uint uVar14;
  uint uVar15;
  undefined4 uStack_34;
  undefined4 uStack_14;
  
  pbVar2 = (byte *)this->buffer_end_;
  pbVar8 = (byte *)this->cursor_;
  pbVar9 = pbVar8;
  if (pbVar8 < pbVar2) {
    do {
      pbVar9 = pbVar8;
      if ((""[(ulong)*pbVar8 + 1] & 1U) == 0) break;
      pbVar8 = pbVar8 + 1;
      this->cursor_ = (char *)pbVar8;
      pbVar9 = pbVar2;
    } while (pbVar8 != pbVar2);
  }
  pTVar7 = anon_unknown_9::Perfect_Hash::InWordSet
                     (this->token_start_,(long)pbVar9 - (long)this->token_start_);
  if (pTVar7 == (TokenInfo *)0x0) {
    TextToken(__return_storage_ptr__,this,Reserved,0);
  }
  else {
    token_type = pTVar7->token_type;
    if (token_type < First_Literal) {
      BareToken(__return_storage_ptr__,this,token_type);
    }
    else if (token_type == First_Type) {
      uVar3 = (this->filename_)._M_dataplus;
      uVar4 = (this->filename_)._M_string_length;
      loc.filename.size_ = uVar4;
      loc.filename.data_ = (char *)uVar3;
      pcVar1 = this->line_start_;
      auVar12._8_4_ = (int)pcVar1;
      auVar12._0_8_ = pcVar1;
      auVar12._12_4_ = (int)((ulong)pcVar1 >> 0x20);
      uVar10 = (int)((long)this->token_start_ - (long)pcVar1) + 1;
      uVar11 = (int)((long)this->cursor_ - auVar12._8_8_) + 1;
      uVar14 = -(uint)(1 < (int)uVar10);
      uVar15 = -(uint)(1 < (int)uVar11);
      loc.field_1.field_0.first_column = ~uVar14 & 1 | uVar10 & uVar14;
      loc.field_1.field_0.line = this->line_;
      loc.field_1._12_4_ = uStack_14;
      loc.field_1.field_0.last_column = ~uVar15 & 1 | uVar11 & uVar15;
      Token::Token(__return_storage_ptr__,loc,First_Type,(Type)(pTVar7->field_2).value_type.enum_);
    }
    else {
      if (0x3d < token_type - AtomicLoad) {
        __assert_fail("IsTokenTypeOpcode(info->token_type)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/asbish[P]wabt/src/wast-lexer.cc"
                      ,0x222,"Token wabt::WastLexer::GetKeywordToken()");
      }
      uVar5 = (this->filename_)._M_dataplus;
      uVar6 = (this->filename_)._M_string_length;
      loc_00.filename.size_ = uVar6;
      loc_00.filename.data_ = (char *)uVar5;
      pcVar1 = this->line_start_;
      auVar13._8_4_ = (int)pcVar1;
      auVar13._0_8_ = pcVar1;
      auVar13._12_4_ = (int)((ulong)pcVar1 >> 0x20);
      uVar10 = (int)((long)this->token_start_ - (long)pcVar1) + 1;
      uVar11 = (int)((long)this->cursor_ - auVar13._8_8_) + 1;
      uVar14 = -(uint)(1 < (int)uVar10);
      uVar15 = -(uint)(1 < (int)uVar11);
      loc_00.field_1.field_0.first_column = ~uVar14 & 1 | uVar10 & uVar14;
      loc_00.field_1.field_0.line = this->line_;
      loc_00.field_1._12_4_ = uStack_34;
      loc_00.field_1.field_0.last_column = ~uVar15 & 1 | uVar11 & uVar15;
      Token::Token(__return_storage_ptr__,loc_00,token_type,(Opcode)(pTVar7->field_2).opcode.enum_);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

Token WastLexer::GetKeywordToken() {
  ReadReservedChars();
  TokenInfo* info =
      Perfect_Hash::InWordSet(token_start_, cursor_ - token_start_);
  if (!info) {
    return TextToken(TokenType::Reserved);
  }
  if (IsTokenTypeBare(info->token_type)) {
    return BareToken(info->token_type);
  } else if (IsTokenTypeType(info->token_type)) {
    return Token(GetLocation(), info->token_type, info->value_type);
  } else {
    assert(IsTokenTypeOpcode(info->token_type));
    return Token(GetLocation(), info->token_type, info->opcode);
  }
}